

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

int mg_map_insert2(mg_map *map,mg_string *key,mg_value *value)

{
  uint32_t uVar1;
  mg_value *in_RDX;
  mg_map *in_RSI;
  mg_map *in_RDI;
  char *in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI->size < in_RDI->capacity) {
    uVar1 = mg_map_find_key(in_RSI,(uint32_t)((ulong)in_RDX >> 0x20),in_stack_ffffffffffffffd8);
    if (uVar1 == in_RDI->size) {
      mg_map_append(in_RDI,(mg_string *)in_RSI,in_RDX);
      local_4 = 0;
    }
    else {
      local_4 = -7;
    }
  }
  else {
    local_4 = -4;
  }
  return local_4;
}

Assistant:

int mg_map_insert2(mg_map *map, mg_string *key, mg_value *value) {
  if (map->size >= map->capacity) {
    return MG_ERROR_CONTAINER_FULL;
  }
  if (mg_map_find_key(map, key->size, key->data) != map->size) {
    return MG_ERROR_DUPLICATE_KEY;
  }
  mg_map_append(map, key, value);
  return 0;
}